

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp analyze_var_ref(sexp ctx,sexp x,sexp_conflict *varenv)

{
  double dVar1;
  sexp psVar2;
  sexp psVar3;
  sexp cell;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  psVar3 = (ctx->value).type.cpl;
  local_38.var = &local_40;
  local_40 = (sexp)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = sexp_env_cell_loc(ctx,psVar3,x,0,varenv);
  psVar2 = local_40;
  if ((local_40 == (sexp)0x0) &&
     (psVar2 = sexp_env_cell_loc(ctx,psVar3,x,0,varenv), psVar2 == (sexp)0x0)) {
    psVar2 = sexp_env_cell_define(ctx,psVar3,x,(sexp)&DAT_0000053e,varenv);
  }
  local_40 = psVar2;
  psVar2 = local_40;
  psVar3 = (local_40->value).type.cpl;
  if ((((ulong)psVar3 & 3) == 0) &&
     ((psVar3->tag == 0x15 || ((((ulong)psVar3 & 3) == 0 && (psVar3->tag == 0x19)))))) {
    psVar3 = sexp_compile_error(ctx,"invalid use of syntax as value",x);
  }
  else {
    dVar1 = (local_40->value).flonum;
    psVar3 = sexp_alloc_tagged_aux(ctx,0x20,0x1e);
    (psVar3->value).flonum = dVar1;
    (psVar3->value).type.cpl = psVar2;
  }
  (ctx->value).context.saves = local_38.next;
  return psVar3;
}

Assistant:

static sexp analyze_var_ref (sexp ctx, sexp x, sexp *varenv) {
  sexp env = sexp_context_env(ctx), res;
  sexp_gc_var1(cell);
  sexp_gc_preserve1(ctx, cell);
  cell = sexp_env_cell_loc(ctx, env, x, 0, varenv);
  if (! cell) {
    cell = sexp_env_cell_create(ctx, env, x, SEXP_UNDEF, varenv);
  }
  if (sexp_macrop(sexp_cdr(cell)) || sexp_corep(sexp_cdr(cell))) {
    res = sexp_compile_error(ctx, "invalid use of syntax as value", x);
  } else {
    res = sexp_make_ref(ctx, sexp_car(cell), cell);
  }
  sexp_gc_release1(ctx);
  return res;
}